

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::Tsub<double>(VM *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  
  ensureStackUsed(this,2);
  iVar3 = this->_sp;
  this->_sp = iVar3 + -2;
  dVar1 = *(double *)
           ((this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl + (long)iVar3 + -2);
  ensureStackUsed(this,2);
  iVar3 = this->_sp;
  this->_sp = iVar3 + -2;
  dVar2 = *(double *)
           ((this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl + (long)iVar3 + -2);
  ensureStackRest(this,2);
  iVar3 = this->_sp;
  *(double *)
   ((this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl + iVar3) = dVar2 - dVar1;
  this->_sp = iVar3 + 2;
  return;
}

Assistant:

void VM::Tsub() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    PUSH(lhs-rhs);
}